

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::UniformCase::renderTest
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,ShaderProgram *program,Random *rnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deBool dVar6;
  deUint32 dVar7;
  TestLog *this_00;
  RenderTarget *this_01;
  size_type sVar8;
  const_reference pvVar9;
  MessageBuilder *pMVar10;
  RenderContext *pRVar11;
  VarValue *value;
  VarValue *value_00;
  bool local_74a;
  MessageBuilder local_720;
  undefined4 local_59c;
  MessageBuilder local_598;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  LogImage local_3c8;
  RGBA local_334;
  RGBA local_330;
  int local_32c;
  int local_328;
  int x;
  int y;
  int numFailedPixels;
  PrimitiveList local_2f8;
  allocator<char> local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  VertexArrayBinding binding;
  string local_248;
  MessageBuilder local_228;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  int local_84;
  int local_80;
  int i_1;
  int j;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  Surface renderedImg;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  TestLog *log;
  Random *rnd_local;
  ShaderProgram *program_local;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  this_01 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(this_01);
  iVar2 = de::min<int>(iVar2,0x20);
  iVar3 = tcu::RenderTarget::getHeight(this_01);
  iVar3 = de::min<int>(iVar3,0x20);
  iVar4 = tcu::RenderTarget::getWidth(this_01);
  renderedImg.m_pixels.m_cap._4_4_ = de::Random::getInt(rnd,0,iVar4 - iVar2);
  iVar4 = tcu::RenderTarget::getHeight(this_01);
  renderedImg.m_pixels.m_cap._0_4_ = de::Random::getInt(rnd,0,iVar4 - iVar3);
  tcu::Surface::Surface((Surface *)local_68,iVar2,iVar3);
  for (local_6c = 0; iVar4 = local_6c,
      sVar8 = std::
              vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
              ::size(basicUniforms), iVar4 < (int)sVar8; local_6c = local_6c + 1) {
    pvVar9 = std::
             vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
             ::operator[](basicUniforms,(long)local_6c);
    bVar1 = glu::isDataTypeSampler(pvVar9->type);
    if (bVar1) {
      for (local_80 = 0; local_80 < local_6c; local_80 = local_80 + 1) {
        pvVar9 = std::
                 vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                 ::operator[](basicUniforms,(long)local_80);
        bVar1 = glu::isDataTypeSampler(pvVar9->type);
        if (bVar1) {
          std::
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          ::operator[](basicUniforms,(long)local_6c);
          std::
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          ::operator[](basicUniforms,(long)local_80);
        }
      }
    }
  }
  for (local_84 = 0; iVar4 = local_84,
      sVar8 = std::
              vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
              ::size(basicUniforms), iVar4 < (int)sVar8; local_84 = local_84 + 1) {
    pvVar9 = std::
             vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
             ::operator[](basicUniforms,(long)local_84);
    bVar1 = glu::isDataTypeSampler(pvVar9->type);
    local_74a = false;
    if (bVar1) {
      local_98._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             (&this->m_filledTextureUnits);
      local_a0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&this->m_filledTextureUnits);
      pvVar9 = std::
               vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      local_90 = std::
                 find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                           (local_98,local_a0,(pvVar9->finalValue).val.intV);
      local_a8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&this->m_filledTextureUnits);
      local_74a = __gnu_cxx::operator==(&local_90,&local_a8);
    }
    if (local_74a != false) {
      tcu::TestLog::operator<<(&local_228,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_228,(char (*) [28])"// Filling texture at unit ");
      pvVar9 = std::
               vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      apiVarValueStr_abi_cxx11_(&local_248,(Functional *)&pvVar9->finalValue,value);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_248);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])0xf46e15);
      pvVar9 = std::
               vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      shaderVarValueStr_abi_cxx11_
                ((string *)&binding.pointer.data,(Functional *)&pvVar9->finalValue,value_00);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&binding.pointer.data);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&binding.pointer.data);
      std::__cxx11::string::~string((string *)&local_248);
      tcu::MessageBuilder::~MessageBuilder(&local_228);
      pvVar9 = std::
               vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               ::operator[](basicUniforms,(long)local_84);
      setupTexture(this,&pvVar9->finalValue);
    }
  }
  do {
    glu::CallLogWrapper::glViewport
              (&this->super_CallLogWrapper,renderedImg.m_pixels.m_cap._4_4_,
               (int)renderedImg.m_pixels.m_cap,iVar2,iVar3);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,"glViewport(viewportX, viewportY, viewportW, viewportH)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                    ,0x64a);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glu::CallLogWrapper::glClearColor(&this->super_CallLogWrapper,0.0,0.0,0.0,1.0);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                    ,0x64b);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glu::CallLogWrapper::glClear(&this->super_CallLogWrapper,0x4000);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                    ,0x64c);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    dVar7 = glu::ShaderProgram::getProgram(program);
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,dVar7);
    GVar5 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar5,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                    ,0x64d);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"a_position",&local_2d9);
  glu::va::Float((VertexArrayBinding *)local_2b8,&local_2d8,4,4,0,renderTest::position);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar7 = glu::ShaderProgram::getProgram(program);
  glu::pr::Triangles(&local_2f8,6,renderTest::indices);
  glu::draw(pRVar11,dVar7,1,(VertexArrayBinding *)local_2b8,&local_2f8,(DrawUtilCallback *)0x0);
  pRVar11 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = renderedImg.m_pixels.m_cap._4_4_;
  iVar2 = (int)renderedImg.m_pixels.m_cap;
  tcu::Surface::getAccess((PixelBufferAccess *)&y,(Surface *)local_68);
  glu::readPixels(pRVar11,iVar3,iVar2,(PixelBufferAccess *)&y);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_2b8);
  x = 0;
  for (local_328 = 0; iVar2 = local_328, iVar3 = tcu::Surface::getHeight((Surface *)local_68),
      iVar2 < iVar3; local_328 = local_328 + 1) {
    for (local_32c = 0; iVar2 = local_32c, iVar3 = tcu::Surface::getWidth((Surface *)local_68),
        iVar2 < iVar3; local_32c = local_32c + 1) {
      local_330 = tcu::Surface::getPixel((Surface *)local_68,local_32c,local_328);
      local_334 = tcu::RGBA::green();
      bVar1 = tcu::RGBA::operator!=(&local_330,&local_334);
      if (bVar1) {
        x = x + 1;
      }
    }
  }
  bVar1 = x < 1;
  if (bVar1) {
    tcu::TestLog::operator<<(&local_720,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_720,
                         (char (*) [65])
                         "Success: got all-green pixels (all uniforms have correct values)");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_720);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"RenderedImage",&local_3e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"Rendered image",&local_411);
    tcu::LogImage::LogImage
              (&local_3c8,&local_3e8,&local_410,(Surface *)local_68,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_00,&local_3c8);
    tcu::LogImage::~LogImage(&local_3c8);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    tcu::TestLog::operator<<(&local_598,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_598,(char (*) [39])"FAILURE: image comparison failed, got ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&x);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [18])" non-green pixels");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_598);
  }
  local_59c = 1;
  tcu::Surface::~Surface((Surface *)local_68);
  return bVar1;
}

Assistant:

bool UniformCase::renderTest (const vector<BasicUniform>& basicUniforms, const ShaderProgram& program, Random& rnd)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	const int					viewportW		= de::min<int>(renderTarget.getWidth(),		MAX_RENDER_WIDTH);
	const int					viewportH		= de::min<int>(renderTarget.getHeight(),	MAX_RENDER_HEIGHT);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);
	tcu::Surface				renderedImg		(viewportW, viewportH);

	// Assert that no two samplers of different types have the same texture unit - this is an error in GL.
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type))
		{
			for (int j = 0; j < i; j++)
			{
				if (glu::isDataTypeSampler(basicUniforms[j].type) && basicUniforms[i].type != basicUniforms[j].type)
					DE_ASSERT(basicUniforms[i].finalValue.val.samplerV.unit != basicUniforms[j].finalValue.val.samplerV.unit);
			}
		}
	}

	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type) && std::find(m_filledTextureUnits.begin(), m_filledTextureUnits.end(), basicUniforms[i].finalValue.val.samplerV.unit) == m_filledTextureUnits.end())
		{
			log << TestLog::Message << "// Filling texture at unit " << apiVarValueStr(basicUniforms[i].finalValue) << " with color " << shaderVarValueStr(basicUniforms[i].finalValue) << TestLog::EndMessage;
			setupTexture(basicUniforms[i].finalValue);
		}
	}

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportW, viewportH));
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	{
		static const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		static const deUint16			indices[]	= { 0, 1, 2, 2, 1, 3 };
		const glu::VertexArrayBinding	binding		= glu::va::Float("a_position", 4, 4, 0, &position[0]);

		glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &binding, glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());
	}

	int numFailedPixels = 0;
	for (int y = 0; y < renderedImg.getHeight(); y++)
	{
		for (int x = 0; x < renderedImg.getWidth(); x++)
		{
			if (renderedImg.getPixel(x, y) != tcu::RGBA::green())
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("RenderedImage", "Rendered image", renderedImg);
		log << TestLog::Message << "FAILURE: image comparison failed, got " << numFailedPixels << " non-green pixels" << TestLog::EndMessage;
		return false;
	}
	else
	{
		log << TestLog::Message << "Success: got all-green pixels (all uniforms have correct values)" << TestLog::EndMessage;
		return true;
	}
}